

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsPerCategory
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outLogLikelihoodPerCategory)

{
  undefined1 auVar1 [16];
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  iVar11 = this->kCategoryCount;
  if (0 < iVar11) {
    lVar10 = 0;
    iVar7 = 0;
    pdVar3 = this->gPartials[bufferIndex];
    pdVar4 = this->gStateFrequencies[stateFrequenciesIndex];
    iVar8 = this->kPatternCount;
    iVar5 = 0;
    do {
      if (0 < iVar8) {
        lVar10 = (long)(int)lVar10;
        iVar11 = 0;
        do {
          iVar8 = this->kStateCount;
          if ((long)iVar8 < 1) {
            dVar12 = 0.0;
          }
          else {
            auVar13 = ZEXT816(0);
            lVar6 = 0;
            do {
              auVar14._8_8_ = 0;
              auVar14._0_8_ = pdVar3[iVar7 + lVar6];
              auVar1._8_8_ = 0;
              auVar1._0_8_ = pdVar4[lVar6];
              auVar13 = vfmadd231sd_fma(auVar13,auVar14,auVar1);
              dVar12 = auVar13._0_8_;
              lVar6 = lVar6 + 1;
            } while (iVar8 != lVar6);
            iVar7 = iVar7 + iVar8;
          }
          dVar12 = log(dVar12);
          outLogLikelihoodPerCategory[lVar10] = dVar12;
          lVar10 = lVar10 + 1;
          iVar11 = iVar11 + 1;
          iVar8 = this->kPatternCount;
        } while (iVar11 < iVar8);
        iVar11 = this->kCategoryCount;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar11);
  }
  if ((-1 < scalingFactorsIndex) && (0 < iVar11)) {
    iVar8 = 0;
    iVar5 = 0;
    pdVar3 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    uVar2 = this->kPatternCount;
    do {
      if (0 < (int)uVar2) {
        uVar9 = 0;
        do {
          outLogLikelihoodPerCategory[(long)iVar5 + uVar9] =
               pdVar3[uVar9] + outLogLikelihoodPerCategory[(long)iVar5 + uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
        iVar5 = iVar5 + (int)uVar9;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar11);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsPerCategory(
        const int bufferIndex,
        const int stateFrequenciesIndex,
        const int scalingFactorsIndex,
        double* outLogLikelihoodPerCategory) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    int u = 0;
    int v = 0;
    for (int l = 0; l < kCategoryCount; l++) {
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += rootPartials[v] * freqs[i];
                v++;
            }
            outLogLikelihoodPerCategory[u] = log(sum);
            u++;
            v += P_PAD;
        }
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        int u = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                outLogLikelihoodPerCategory[u] += cumulativeScaleFactors[i];
                u++;
            }
        }
    }

    return returnCode;
}